

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

CURLcode H2_CONNECT(Curl_cfilter *cf,Curl_easy *data,tunnel_stream *ts)

{
  void *pvVar1;
  CURLcode local_34;
  CURLcode result;
  cf_h2_proxy_ctx *ctx;
  tunnel_stream *ts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  local_34 = CURLE_OK;
LAB_00c258af:
  switch(ts->state) {
  case H2_TUNNEL_INIT:
    break;
  case H2_TUNNEL_CONNECT:
    goto switchD_00c258d9_caseD_1;
  case H2_TUNNEL_RESPONSE:
    goto LAB_00c259ed;
  case H2_TUNNEL_ESTABLISHED:
    return CURLE_OK;
  case H2_TUNNEL_FAILED:
    return CURLE_RECV_ERROR;
  default:
    goto switchD_00c258d9_default;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
      (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"[0] CONNECT start for %s",ts->authority);
  }
  local_34 = submit_CONNECT(cf,data,ts);
  if (local_34 != CURLE_OK) goto LAB_00c25a34;
  h2_tunnel_go_state(cf,ts,H2_TUNNEL_CONNECT,data);
switchD_00c258d9_caseD_1:
  local_34 = proxy_h2_progress_ingress(cf,data);
  if (local_34 == CURLE_OK) {
    local_34 = proxy_h2_progress_egress(cf,data);
  }
  if ((local_34 == CURLE_OK) || (local_34 == CURLE_AGAIN)) {
    if ((ts->field_0xa4 & 1) == 0) {
      local_34 = CURLE_OK;
      goto LAB_00c25a34;
    }
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_RESPONSE,data);
LAB_00c259ed:
    local_34 = inspect_response(cf,data,ts);
    if (local_34 != CURLE_OK) goto LAB_00c25a34;
  }
  else {
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_FAILED,data);
  }
switchD_00c258d9_default:
  if (ts->state != H2_TUNNEL_INIT) {
LAB_00c25a34:
    if ((local_34 != CURLE_OK) || ((*(byte *)((long)pvVar1 + 0x134) >> 1 & 1) != 0)) {
      h2_tunnel_go_state(cf,ts,H2_TUNNEL_FAILED,data);
    }
    return local_34;
  }
  goto LAB_00c258af;
}

Assistant:

static CURLcode H2_CONNECT(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           struct tunnel_stream *ts)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(ts);
  DEBUGASSERT(ts->authority);
  do {
    switch(ts->state) {
    case H2_TUNNEL_INIT:
      /* Prepare the CONNECT request and make a first attempt to send. */
      CURL_TRC_CF(data, cf, "[0] CONNECT start for %s", ts->authority);
      result = submit_CONNECT(cf, data, ts);
      if(result)
        goto out;
      h2_tunnel_go_state(cf, ts, H2_TUNNEL_CONNECT, data);
      FALLTHROUGH();

    case H2_TUNNEL_CONNECT:
      /* see that the request is completely sent */
      result = proxy_h2_progress_ingress(cf, data);
      if(!result)
        result = proxy_h2_progress_egress(cf, data);
      if(result && result != CURLE_AGAIN) {
        h2_tunnel_go_state(cf, ts, H2_TUNNEL_FAILED, data);
        break;
      }

      if(ts->has_final_response) {
        h2_tunnel_go_state(cf, ts, H2_TUNNEL_RESPONSE, data);
      }
      else {
        result = CURLE_OK;
        goto out;
      }
      FALLTHROUGH();

    case H2_TUNNEL_RESPONSE:
      DEBUGASSERT(ts->has_final_response);
      result = inspect_response(cf, data, ts);
      if(result)
        goto out;
      break;

    case H2_TUNNEL_ESTABLISHED:
      return CURLE_OK;

    case H2_TUNNEL_FAILED:
      return CURLE_RECV_ERROR;

    default:
      break;
    }

  } while(ts->state == H2_TUNNEL_INIT);

out:
  if(result || ctx->tunnel.closed)
    h2_tunnel_go_state(cf, ts, H2_TUNNEL_FAILED, data);
  return result;
}